

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric.cpp
# Opt level: O2

Level * __thiscall hta::Metric::get_level(Metric *this,Duration interval)

{
  iterator iVar1;
  pair<std::_Rb_tree_iterator<std::pair<const_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_hta::Level>_>,_bool>
  pVar2;
  Duration local_60;
  Level local_58;
  
  local_60.__r = interval.__r;
  iVar1 = std::
          _Rb_tree<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_std::pair<const_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_hta::Level>,_std::_Select1st<std::pair<const_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_hta::Level>_>,_std::less<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::pair<const_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_hta::Level>_>_>
          ::find(&(this->levels_)._M_t,&local_60);
  if ((_Rb_tree_header *)iVar1._M_node == &(this->levels_)._M_t._M_impl.super__Rb_tree_header) {
    restore_level(&local_58,this,local_60);
    pVar2 = std::
            map<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_hta::Level,_std::less<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::pair<const_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_hta::Level>_>_>
            ::try_emplace<hta::Level>(&this->levels_,&local_60,&local_58);
    iVar1._M_node = (_Base_ptr)pVar2.first._M_node;
  }
  return (Level *)&iVar1._M_node[1]._M_parent;
}

Assistant:

Level& Metric::get_level(Duration interval)
{
    auto it = levels_.find(interval);
    if (it == levels_.end())
    {
        bool added;
        std::tie(it, added) = levels_.try_emplace(interval, restore_level(interval));
    }
    return it->second;
}